

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::split_selected_edge(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *this_00;
  XFormWidget *pXVar2;
  Edge *pEVar3;
  VertexIter VVar4;
  
  pSVar1 = (this->super_SceneObject).scene;
  if (((pSVar1 != (Scene *)0x0) &&
      (this_00 = (pSVar1->selected).element, this_00 != (HalfedgeElement *)0x0)) &&
     (pEVar3 = HalfedgeElement::getEdge(this_00), pEVar3 != (Edge *)0x0)) {
    VVar4 = HalfedgeMesh::splitEdge(&this->mesh,(pEVar3->_halfedge)._M_node[3]._M_next);
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).element = (HalfedgeElement *)(VVar4._M_node + 1);
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).axis = None;
    pXVar2 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar2->target).coordinates.x = 0.0;
    (pXVar2->target).coordinates.y = 0.0;
    (pXVar2->target).object = (SceneObject *)0x0;
    (pXVar2->target).element = (HalfedgeElement *)0x0;
    (pXVar2->target).coordinates.z = 0.0;
    (pXVar2->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::split_selected_edge() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   if (edge == nullptr) return;
   VertexIter v = mesh.splitEdge(edge->halfedge()->edge());
   scene->selected.element = elementAddress( v );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}